

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  ushort uVar1;
  CType *pCVar2;
  CTypeID CVar3;
  int iVar4;
  CPscl CVar5;
  CTypeID CVar6;
  CTypeID CVar7;
  CTInfo CVar8;
  uint uVar9;
  CTSize CVar10;
  uint uVar11;
  uint uVar12;
  CType *pCVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  CTypeID CVar19;
  bool bVar20;
  CType *ct;
  ulong local_6d8;
  uint local_6cc;
  uint local_6c8;
  uint local_6c4;
  CType *local_6c0;
  CTState *local_6b8;
  CPDecl decl;
  
  CVar3 = cp_struct_name(cp,sdecl,sinfo);
  iVar4 = cp_opt(cp,0x7b);
  if (iVar4 == 0) {
    return CVar3;
  }
  bVar20 = false;
  CVar19 = CVar3;
LAB_001310fd:
  if (cp->tok == 0x7d) {
    cp_check(cp,0x7d);
    cp->cts->tab[CVar19].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_6c8 = sdecl->attr;
    local_6c4 = local_6c8 >> 0x10 & 0xf;
    local_6b8 = cp->cts;
    pCVar2 = local_6b8->tab;
    uVar15 = (ulong)CVar3;
    local_6c0 = pCVar2 + uVar15;
    local_6d8 = 0;
    uVar9 = 0;
    uVar16 = pCVar2[uVar15].info;
    while( true ) {
      do {
        uVar1 = pCVar2[uVar15].sib;
        uVar15 = (ulong)uVar1;
        if (uVar15 == 0) {
          local_6c0->info = local_6c4 * 0x10000 + uVar16;
          if ((uVar16 >> 0x17 & 1) == 0) {
            local_6d8 = (ulong)uVar9;
          }
          iVar4 = 8 << ((byte)local_6c4 & 0x1f);
          local_6c0->size = (-iVar4 & (iVar4 + (int)local_6d8) - 1U) >> 3;
          return CVar3;
        }
        uVar14 = pCVar2[uVar1].info;
        uVar17 = pCVar2[uVar1].size;
      } while (((uVar14 & 0xf0000000) != 0x90000000) &&
              (uVar17 == 0 || (uVar14 & 0xf0ff0000) != 0x80030000));
      local_6cc = uVar14 & 0xffff;
      CVar8 = lj_ctype_info(local_6b8,local_6cc,&decl.top);
      if (((0x1fffffff < decl.top) ||
          ((uVar12 = decl.top * 8, ~uVar9 < uVar12 || ((CVar8 & 0x100000) != 0)))) &&
         ((decl.top != 0xffffffff ||
          (((CVar8 & 0xf0000000) != 0x30000000 || (uVar12 = 0, (uVar16 & 0x800000) != 0)))))) break;
      if (((uVar17 | local_6c8) & 2) == 0) {
        uVar18 = CVar8 >> 0x10 & 0xf;
        if (((uVar17 & 1) != 0) && (uVar11 = uVar17 >> 0x10 & 0xf, uVar18 < uVar11)) {
          uVar18 = uVar11;
        }
      }
      else {
        uVar18 = uVar17 >> 0x10 & 0xf;
      }
      pCVar13 = pCVar2 + uVar1;
      uVar11 = (uint)cp->packstack[cp->curpack];
      if (uVar18 < cp->packstack[cp->curpack]) {
        uVar11 = uVar18;
      }
      if (local_6c4 < uVar11) {
        local_6c4 = uVar11;
      }
      iVar4 = 8 << ((byte)uVar11 & 0x1f);
      uVar18 = iVar4 - 1;
      uVar11 = uVar14 >> 0x10 & 0x7f;
      if ((uVar14 & 0xf0000000) == 0x90000000 && uVar11 != 0x7f) {
        if (((uVar17 & 1) != 0 || uVar11 == 0) ||
           ((((uVar17 | local_6c8) & 2) == 0 && (uVar12 < (uVar18 & uVar9) + uVar11)))) {
          uVar9 = -iVar4 & uVar9 + uVar18;
        }
        if ((uVar11 == uVar12) && ((uVar18 & uVar9) == 0)) {
          pCVar13->info = local_6cc | 0x90000000;
          uVar11 = uVar12;
          uVar14 = uVar9;
        }
        else {
          pCVar13->info =
               (uVar12 - 1 & uVar9) + (uVar11 << 8 | CVar8 & 0xb800000) + uVar12 * 0x2000 +
               0xa0000000;
          uVar14 = -uVar12 & uVar9;
        }
      }
      else {
        uVar9 = -iVar4 & uVar18 + uVar9;
        uVar11 = uVar12;
        uVar14 = uVar9;
      }
      uVar17 = (uint)local_6d8;
      uVar12 = uVar17;
      if (uVar17 < uVar11) {
        uVar12 = uVar11;
      }
      pCVar13->size = uVar14 >> 3;
      bVar20 = (uVar16 >> 0x17 & 1) != 0;
      if (bVar20) {
        uVar17 = uVar12;
      }
      local_6d8 = (ulong)uVar17;
      if (bVar20) {
        uVar11 = 0;
      }
      uVar9 = uVar9 + uVar11;
      uVar16 = CVar8 & 0x3100000 | uVar16;
    }
    cp_err(cp,LJ_ERR_FFI_INVSIZE);
  }
  CVar5 = cp_decl_spec(cp,&decl,0x20000);
  decl.mode = 4;
  if (CVar5 == 0) {
    decl.mode = 0xe;
  }
  do {
    if (bVar20) {
      cp_err_token(cp,0x7d);
    }
    decl.bits = 0xffffffff;
    cp_declarator(cp,&decl);
    CVar6 = cp_decl_intern(cp,&decl);
    if ((CVar5 >> 0x11 & 1) == 0) {
      CVar7 = lj_ctype_new(cp->cts,&ct);
      pCVar2 = cp->cts->tab;
      uVar16 = pCVar2[CVar6].info;
      pCVar13 = pCVar2 + CVar6;
      if (decl.bits == 0xffffffff) {
        bVar20 = false;
        if ((uVar16 & 0xf0000000) == 0x30000000) {
          bVar20 = pCVar13->size == 0xffffffff;
        }
        if (decl.name != (GCstr *)0x0) {
          CVar10 = 0x7f;
          goto LAB_0013125b;
        }
        if ((uVar16 & 0xf0000000) != 0x50000000 && (uVar16 & 0xf0100000) != 0x10000000) {
          cp_err_token(cp,0x100);
        }
        ct->info = CVar6 + 0x80030000;
        uVar16 = decl.attr | 0x80000000;
        if ((pCVar13->info & 0xf0000000) != 0x10000000) {
          uVar16 = 0;
        }
        ct->size = uVar16;
      }
      else {
        if ((((uVar16 & 0xf4000000) != 0) || (decl.bits == 0 && decl.name != (GCstr *)0x0)) ||
           (uVar9 = pCVar13->size << 3, 0x20 < uVar9)) {
LAB_00131603:
          cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
        }
        if (0x7ffffff < uVar16) {
          uVar9 = 1;
        }
        if (uVar9 < decl.bits) goto LAB_00131603;
        bVar20 = false;
        CVar10 = decl.bits;
LAB_0013125b:
        ct->info = CVar10 * 0x10000 + CVar6 + 0x90000000;
        ct->size = decl.attr;
        if (decl.name != (GCstr *)0x0) {
          (decl.name)->marked = (decl.name)->marked | 0x20;
          (ct->name).gcptr32 = (uint32_t)decl.name;
        }
      }
      pCVar2[CVar19].sib = (CTypeID1)CVar7;
      CVar19 = CVar7;
    }
    else {
      CVar6 = cp_decl_constinit(cp,&ct,CVar6);
      cp->cts->tab[CVar19].sib = (CTypeID1)CVar6;
      (decl.name)->marked = (decl.name)->marked | 0x20;
      (ct->name).gcptr32 = (uint32_t)decl.name;
      bVar20 = false;
      CVar19 = CVar6;
    }
    iVar4 = cp_opt(cp,0x2c);
    if (iVar4 == 0) break;
    cp_decl_reset(&decl);
  } while( true );
  cp_check(cp,0x3b);
  goto LAB_001310fd;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}